

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_drop_unknown_fields.pb.cc
# Opt level: O2

void unittest_drop_unknown_fields::Foo::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  int iVar2;
  Nullable<const_char_*> failure_msg;
  Foo *_this;
  Foo *local_20;
  MessageLite *local_18 [2];
  
  local_20 = (Foo *)to_msg;
  local_18[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<unittest_drop_unknown_fields::Foo_const*,unittest_drop_unknown_fields::Foo*>
                          ((Foo **)local_18,&local_20,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 3) != 0) {
      if (((uVar1 & 1) != 0) && (iVar2 = (int)from_msg[1]._internal_metadata_.ptr_, iVar2 != 0)) {
        *(int *)((long)&local_20->field_0 + 8) = iVar2;
      }
      if (((uVar1 & 2) != 0) &&
         (iVar2 = *(int *)((long)&from_msg[1]._internal_metadata_.ptr_ + 4), iVar2 != 0)) {
        (local_20->field_0)._impl_.enum_value_ = iVar2;
      }
    }
    (local_20->field_0)._impl_._has_bits_.has_bits_[0] =
         (local_20->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_20->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_drop_unknown_fields.pb.cc"
             ,0x18e,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18);
}

Assistant:

void Foo::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Foo*>(&to_msg);
  auto& from = static_cast<const Foo&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:unittest_drop_unknown_fields.Foo)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (from._internal_int32_value() != 0) {
        _this->_impl_.int32_value_ = from._impl_.int32_value_;
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (from._internal_enum_value() != 0) {
        _this->_impl_.enum_value_ = from._impl_.enum_value_;
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}